

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O3

void __thiscall piksel::Graphics::background(Graphics *this,vec4 color)

{
  stack<piksel::State,_std::deque<piksel::State,_std::allocator<piksel::State>_>_> *psVar1;
  State *pSVar2;
  _Elt_pointer pSVar3;
  float local_28;
  float fStack_24;
  
  push(this);
  psVar1 = this->stateStack;
  pSVar3 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar3 == (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pSVar3 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  local_28 = color.field_0._0_4_;
  fStack_24 = color.field_0._4_4_;
  pSVar3[-1].shaderRelevantState.fillColor.field_0.field_0.x = local_28;
  pSVar3[-1].shaderRelevantState.fillColor.field_0.field_0.y = fStack_24;
  pSVar3[-1].shaderRelevantState.fillColor.field_0.field_0.z = color.field_0._8_4_;
  pSVar3[-1].shaderRelevantState.fillColor.field_0.field_0.w = color.field_0._12_4_;
  pSVar3[-1].shaderIrrelevantState.fill = true;
  psVar1 = this->stateStack;
  pSVar3 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar3 == (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pSVar2 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1];
    pSVar2[1].shaderIrrelevantState.stroke = false;
    pSVar3 = pSVar2 + 2;
  }
  else {
    pSVar3[-1].shaderIrrelevantState.stroke = false;
  }
  pSVar3[-1].shaderIrrelevantState.rectMode = CORNER;
  rect(this,0.0,0.0,(float)*this->framebufferWidth,(float)*this->framebufferHeight);
  pop(this);
  return;
}

Assistant:

void Graphics::background(glm::vec4 color) {
    push();
    fill(color);
    noStroke();
    rectMode(DrawMode::CORNER);
    rect(0.0f, 0.0f, framebufferWidth, framebufferHeight);
    pop();
}